

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm_x86_avx512::forward
          (Gemm_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  _func_int **pp_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  _func_int *p_Var12;
  ulong uVar13;
  Mat *pMVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int j;
  uint uVar21;
  undefined4 uVar22;
  size_t sVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int *piVar28;
  Mat *pMVar29;
  int iVar30;
  int iVar31;
  bool bVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  Mat *local_308;
  Mat *local_2f8;
  Mat *local_2f0;
  int TILE_K;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2c8;
  Gemm_x86_avx512 *local_2b0;
  ulong local_2a8;
  Mat *local_298;
  ulong local_290;
  ulong local_288;
  int TILE_K_1;
  Mat local_278;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  Mat local_218;
  Mat local_1c8;
  ulong local_178;
  ulong local_170;
  Mat local_168;
  ulong local_120;
  Mat local_118;
  int TILE_M;
  int *local_c8;
  size_t local_c0;
  int local_b8;
  Allocator *local_b0;
  int local_a8;
  uint local_a4;
  undefined8 local_a0;
  int local_98;
  size_t local_90;
  int TILE_K_2;
  ulong local_80;
  int TILE_N;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  p_Var12 = this->_vptr_Gemm_x86_avx512[-3];
  iVar10 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar15 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
    if (iVar10 != 0) {
      if (iVar15 == 0) {
        uVar17 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar17 = pMVar1->w;
      }
      goto LAB_0045d112;
    }
    if (iVar15 == 0) {
      uVar17 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
    else {
      uVar17 = pMVar1->w;
    }
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var12) == 0) {
      uVar21 = pMVar1[1].w;
    }
    else {
      uVar21 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
    }
  }
  else if (iVar10 == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = *(uint *)(&this->field_0xec + (long)p_Var12);
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var12) == 0) {
      uVar21 = pMVar1->w;
    }
    else {
      uVar21 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
  }
  else {
    uVar17 = *(uint *)(&this->field_0xec + (long)p_Var12);
LAB_0045d112:
    uVar21 = *(uint *)(&this->field_0xf0 + (long)p_Var12);
  }
  local_278.cstep = 0;
  uVar33 = 0;
  uVar34 = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elempack = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  p_Var12 = this->_vptr_Gemm_x86_avx512[-3];
  local_2b0 = this;
  if (*(int *)(&this->field_0xe8 + (long)p_Var12) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    iVar10 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
    if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
      if (iVar10 == 0) {
        bVar32 = true;
        if (lVar18 == 0xd8) {
          local_278.data = pMVar1[2].data;
          piVar28 = pMVar1[2].refcount;
          sVar23 = pMVar1[2].elemsize;
          local_278.elempack = pMVar1[2].elempack;
          local_278.allocator = pMVar1[2].allocator;
          uVar33._0_4_ = pMVar1[2].dims;
          uVar33._4_4_ = pMVar1[2].w;
          uVar34._0_4_ = pMVar1[2].h;
          uVar34._4_4_ = pMVar1[2].d;
          local_278.c = pMVar1[2].c;
          local_278.cstep = pMVar1[2].cstep;
          if (piVar28 == (int *)0x0) {
            piVar28 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar28 = *piVar28 + 1;
            UNLOCK();
            LOCK();
            *piVar28 = *piVar28 + 1;
            UNLOCK();
            bVar32 = false;
          }
        }
        else {
          local_278.cstep = 0;
          local_278.c = 0;
          local_278.allocator = (Allocator *)0x0;
          local_278.elempack = 0;
          sVar23 = 0;
          piVar28 = (int *)0x0;
          local_278.data = (void *)0x0;
        }
        local_278.refcount._0_4_ = SUB84(piVar28,0);
        local_278.refcount._4_4_ = (uint)((ulong)piVar28 >> 0x20);
        local_278.elemsize._0_4_ = (int)sVar23;
        local_278.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
        local_278.dims = (int)uVar33;
        local_278.w = (int)((ulong)uVar33 >> 0x20);
        local_278.h = (int)uVar34;
        local_278.d = (int)((ulong)uVar34 >> 0x20);
        if (!bVar32) {
          LOCK();
          *piVar28 = *piVar28 + -1;
          UNLOCK();
          if (*piVar28 == 0) {
            if (local_278.allocator == (Allocator *)0x0) goto LAB_0045f62a;
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
      else {
        bVar32 = true;
        if (lVar18 == 0x90) {
          local_278.data = pMVar1[1].data;
          piVar28 = pMVar1[1].refcount;
          sVar23 = pMVar1[1].elemsize;
          local_278.elempack = pMVar1[1].elempack;
          local_278.allocator = pMVar1[1].allocator;
          uVar33._0_4_ = pMVar1[1].dims;
          uVar33._4_4_ = pMVar1[1].w;
          uVar34._0_4_ = pMVar1[1].h;
          uVar34._4_4_ = pMVar1[1].d;
          local_278.c = pMVar1[1].c;
          local_278.cstep = pMVar1[1].cstep;
          if (piVar28 == (int *)0x0) {
            piVar28 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar28 = *piVar28 + 1;
            UNLOCK();
            LOCK();
            *piVar28 = *piVar28 + 1;
            UNLOCK();
            bVar32 = false;
          }
        }
        else {
          local_278.cstep = 0;
          local_278.c = 0;
          local_278.allocator = (Allocator *)0x0;
          local_278.elempack = 0;
          sVar23 = 0;
          piVar28 = (int *)0x0;
          local_278.data = (void *)0x0;
        }
        local_278.refcount._0_4_ = SUB84(piVar28,0);
        local_278.refcount._4_4_ = (uint)((ulong)piVar28 >> 0x20);
        local_278.elemsize._0_4_ = (int)sVar23;
        local_278.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
        local_278.dims = (int)uVar33;
        local_278.w = (int)((ulong)uVar33 >> 0x20);
        local_278.h = (int)uVar34;
        local_278.d = (int)((ulong)uVar34 >> 0x20);
        if (!bVar32) {
          LOCK();
          *piVar28 = *piVar28 + -1;
          UNLOCK();
          if (*piVar28 == 0) {
            if (local_278.allocator == (Allocator *)0x0) goto LAB_0045f62a;
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
    }
    else if (iVar10 == 0) {
      bVar32 = true;
      if (lVar18 == 0x90) {
        local_278.data = pMVar1[1].data;
        piVar28 = pMVar1[1].refcount;
        sVar23 = pMVar1[1].elemsize;
        local_278.elempack = pMVar1[1].elempack;
        local_278.allocator = pMVar1[1].allocator;
        uVar33._0_4_ = pMVar1[1].dims;
        uVar33._4_4_ = pMVar1[1].w;
        uVar34._0_4_ = pMVar1[1].h;
        uVar34._4_4_ = pMVar1[1].d;
        local_278.c = pMVar1[1].c;
        local_278.cstep = pMVar1[1].cstep;
        if (piVar28 == (int *)0x0) {
          piVar28 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar28 = *piVar28 + 1;
          UNLOCK();
          LOCK();
          *piVar28 = *piVar28 + 1;
          UNLOCK();
          bVar32 = false;
        }
      }
      else {
        local_278.cstep = 0;
        local_278.c = 0;
        local_278.allocator = (Allocator *)0x0;
        local_278.elempack = 0;
        sVar23 = 0;
        piVar28 = (int *)0x0;
        local_278.data = (void *)0x0;
      }
      local_278.refcount._0_4_ = SUB84(piVar28,0);
      local_278.refcount._4_4_ = (uint)((ulong)piVar28 >> 0x20);
      local_278.elemsize._0_4_ = (int)sVar23;
      local_278.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
      local_278.dims = (int)uVar33;
      local_278.w = (int)((ulong)uVar33 >> 0x20);
      local_278.h = (int)uVar34;
      local_278.d = (int)((ulong)uVar34 >> 0x20);
      if (!bVar32) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_278.allocator == (Allocator *)0x0) goto LAB_0045f62a;
          (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
        }
      }
    }
    else {
      bVar32 = true;
      if (lVar18 == 0x48) {
        local_278.data = pMVar1->data;
        piVar28 = pMVar1->refcount;
        sVar23 = pMVar1->elemsize;
        local_278.elempack = pMVar1->elempack;
        local_278.allocator = pMVar1->allocator;
        uVar33._0_4_ = pMVar1->dims;
        uVar33._4_4_ = pMVar1->w;
        uVar34._0_4_ = pMVar1->h;
        uVar34._4_4_ = pMVar1->d;
        local_278.c = pMVar1->c;
        local_278.cstep = pMVar1->cstep;
        if (piVar28 == (int *)0x0) {
          piVar28 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar28 = *piVar28 + 1;
          UNLOCK();
          LOCK();
          *piVar28 = *piVar28 + 1;
          UNLOCK();
          bVar32 = false;
        }
      }
      else {
        local_278.allocator = (Allocator *)0x0;
        local_278.elempack = 0;
        sVar23 = 0;
        piVar28 = (int *)0x0;
        local_278.data = (void *)0x0;
        local_278.c = 0;
        local_278.cstep = 0;
      }
      local_278.refcount._0_4_ = SUB84(piVar28,0);
      local_278.refcount._4_4_ = (uint)((ulong)piVar28 >> 0x20);
      local_278.elemsize._0_4_ = (int)sVar23;
      local_278.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
      local_278.dims = (int)uVar33;
      local_278.w = (int)((ulong)uVar33 >> 0x20);
      local_278.h = (int)uVar34;
      local_278.d = (int)((ulong)uVar34 >> 0x20);
      local_2c8 = top_blobs;
      if (!bVar32) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_278.allocator == (Allocator *)0x0) {
LAB_0045f62a:
            free(local_278.data);
          }
          else {
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
    }
    pvVar7 = local_2c8;
    uVar13 = (ulong)local_2c8 >> 0x20;
    local_2c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(uVar13 << 0x20);
    if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0)) {
      local_2c8._4_4_ = SUB84(pvVar7,4);
      uVar22 = local_2c8._4_4_;
      if (local_278.dims == 1) {
        uVar11 = (uint)(local_278.w * local_278.elempack == uVar17);
        if (local_278.w * local_278.elempack == uVar21) {
          uVar11 = 4;
        }
        local_2c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                    CONCAT44(local_2c8._4_4_,uVar11);
      }
      else {
        bVar32 = local_278.dims == 2;
        local_2c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(uVar13 << 0x20);
        if (local_278.w == 1U && bVar32) {
          local_2c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                      CONCAT44(uVar22,(uint)(local_278.elempack * local_278.h == uVar17) * 2);
        }
        if ((local_278.w == 1U && bVar32 || bVar32) && (local_278.w == uVar21)) {
          uVar22 = (int)local_2c8;
          if (local_278.elempack * local_278.h == uVar17) {
            uVar22 = 3;
          }
          if (local_278.elempack * local_278.h == 1) {
            uVar22 = 4;
          }
          local_2c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                      CONCAT44(local_2c8._4_4_,uVar22);
        }
      }
      if (*(float *)((long)&(this->CT_data).d + (long)this->_vptr_Gemm_x86_avx512[-3]) != 1.0) {
        local_1c8.cstep = 0;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        local_1c8.w = local_1c8.refcount._4_4_;
        local_1c8.h = (int)local_1c8.elemsize;
        Mat::create_like(&local_1c8,&local_278,opt->workspace_allocator);
        uVar11 = local_278.c * (int)local_278.cstep * local_278.elempack;
        pp_Var2 = this->_vptr_Gemm_x86_avx512;
        uVar26 = 0;
        uVar13 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar13 = uVar26;
        }
        for (; uVar13 != uVar26; uVar26 = uVar26 + 1) {
          *(float *)((long)local_1c8.data + uVar26 * 4) =
               *(float *)((long)&(this->CT_data).d + (long)pp_Var2[-3]) *
               *(float *)((long)local_278.data + uVar26 * 4);
        }
        piVar28 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar28 != (int *)0x0) {
          LOCK();
          *piVar28 = *piVar28 + 1;
          UNLOCK();
        }
        piVar28 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
        if (piVar28 != (int *)0x0) {
          LOCK();
          *piVar28 = *piVar28 + -1;
          UNLOCK();
          if (*piVar28 == 0) {
            if (local_278.allocator == (Allocator *)0x0) {
              free(local_278.data);
            }
            else {
              (*(local_278.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar28 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        local_278.data = local_1c8.data;
        local_278.refcount._0_4_ = local_1c8.refcount._0_4_;
        local_278.refcount._4_4_ = local_1c8.refcount._4_4_;
        local_278.elemsize._0_4_ = (int)local_1c8.elemsize;
        local_278.elemsize._4_4_ = local_1c8.elemsize._4_4_;
        local_278.elempack = local_1c8.elempack;
        local_278.allocator = local_1c8.allocator;
        local_278.dims = local_1c8.dims;
        local_278.w = local_1c8.w;
        local_278.h = local_1c8.h;
        local_278.d = local_1c8.d;
        local_278.c = local_1c8.c;
        local_278.cstep = local_1c8.cstep;
        if (piVar28 != (int *)0x0) {
          LOCK();
          *piVar28 = *piVar28 + -1;
          UNLOCK();
          if (*piVar28 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) {
              free(local_1c8.data);
            }
            else {
              (*(local_1c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
    if (&local_278 != &this->CT_data) {
      piVar28 = (this->CT_data).refcount;
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + 1;
        UNLOCK();
      }
      local_278.data = (this->CT_data).data;
      piVar28 = (this->CT_data).refcount;
      local_278.refcount._0_4_ = SUB84(piVar28,0);
      local_278.refcount._4_4_ = (uint)((ulong)piVar28 >> 0x20);
      sVar23 = (this->CT_data).elemsize;
      local_278.elemsize._0_4_ = (int)sVar23;
      local_278.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
      local_278.elempack = (this->CT_data).elempack;
      local_278.allocator = (this->CT_data).allocator;
      uVar3 = (this->CT_data).dims;
      uVar4 = (this->CT_data).w;
      uVar5 = (this->CT_data).h;
      uVar6 = (this->CT_data).d;
      local_278.c = (this->CT_data).c;
      local_278.cstep = (this->CT_data).cstep;
      p_Var12 = this->_vptr_Gemm_x86_avx512[-3];
      local_278.dims = uVar3;
      local_278.w = uVar4;
      local_278.h = uVar5;
      local_278.d = uVar6;
    }
    local_2c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                CONCAT44(local_2c8._4_4_,*(undefined4 *)(&this->field_0xf8 + (long)p_Var12));
  }
  p_Var12 = this->_vptr_Gemm_x86_avx512[-3];
  if (opt->use_packing_layout == true) {
    uVar11 = uVar21;
    if (*(int *)(&this->field_0x108 + (long)p_Var12) == 0) {
      uVar11 = uVar17;
    }
    if ((uVar11 & 0xf) == 0) {
      local_80 = 0x10;
    }
    else if ((uVar11 & 7) == 0) {
      local_80 = 8;
    }
    else {
      local_80 = (ulong)((uint)((uVar11 & 3) == 0) * 3 + 1);
    }
  }
  else {
    local_80 = 1;
  }
  if (*(uint *)(&this->field_0x100 + (long)p_Var12) != 0) {
    local_80 = (ulong)*(uint *)(&this->field_0x100 + (long)p_Var12);
  }
  iVar10 = (int)local_80;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar11 = uVar21;
  if (*(int *)(&this->field_0x108 + (long)p_Var12) != 0) {
    uVar11 = uVar17;
    uVar17 = uVar21;
  }
  if (*(int *)(&this->field_0xfc + (long)p_Var12) == 0) {
    Mat::create(this_00,uVar11,(int)uVar17 / iVar10,(ulong)(uint)(iVar10 * 4),iVar10,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar11,1,(int)uVar17 / iVar10,(ulong)(uint)(iVar10 * 4),iVar10,
                opt->blob_allocator);
  }
  iVar10 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_0045f3af;
  iVar10 = this->nT;
  iVar15 = iVar10;
  if (iVar10 == 0) {
    iVar15 = opt->num_threads;
  }
  if (opt->num_threads != iVar10 && iVar10 != 0) {
    fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d");
    fputc(10,_stderr);
  }
  p_Var12 = this->_vptr_Gemm_x86_avx512[-3];
  iVar10 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
    pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (iVar10 == 0) {
      iVar10 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
      iVar30 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var12);
      if (iVar10 == 0) {
        iVar20 = pMVar14->elempack * (&pMVar14->h)[(ulong)(pMVar14->dims == 3) * 2];
        iVar8 = pMVar14->w;
      }
      else {
        iVar20 = pMVar14->w;
        iVar8 = pMVar14->elempack * (&pMVar14->h)[(ulong)(pMVar14->dims == 3) * 2];
      }
      if (iVar30 == 0) {
        uVar17 = pMVar14[1].w;
      }
      else {
        uVar17 = pMVar14[1].elempack * (&pMVar14[1].h)[(ulong)(pMVar14[1].dims == 3) * 2];
      }
      local_290 = (ulong)uVar17;
      local_230 = CONCAT44(local_230._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var12));
      get_optimal_tile_mnk
                (iVar20,uVar17,iVar8,*(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_K,&TILE_K_1,&TILE_K_2,iVar15);
      local_120 = (ulong)(uint)TILE_K;
      local_178 = CONCAT44(local_178._4_4_,(iVar20 + TILE_K + -1) / TILE_K);
      iVar19 = (iVar8 + TILE_K_2 + -1) / TILE_K_2;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_2 * TILE_K,iVar19,iVar15,4,opt->workspace_allocator);
      iVar31 = ((int)local_290 + TILE_K_1 + -1) / TILE_K_1;
      local_218.cstep = 0;
      local_218.data = (void *)0x0;
      local_218.refcount._0_4_ = 0;
      local_218.refcount._4_4_ = 0;
      local_218.elemsize._0_4_ = 0;
      local_218.elemsize._4_4_ = 0;
      local_218.elempack = 0;
      local_218.allocator = (Allocator *)0x0;
      local_218.dims = 0;
      local_218.w = 0;
      local_218.h = 0;
      local_218.d = 0;
      local_218.c = 0;
      local_298 = (Mat *)(ulong)(uint)TILE_K_2;
      local_220 = (ulong)(uint)TILE_K_1;
      Mat::create(&local_218,TILE_K_2 * TILE_K_1,iVar19,iVar31,4,opt->workspace_allocator);
      iVar31 = iVar31 * iVar19;
      iVar20 = 0;
      if (iVar31 < 1) {
        iVar31 = 0;
        iVar20 = 0;
      }
      while( true ) {
        uVar13 = local_220;
        iVar25 = (int)local_220;
        if (iVar31 == iVar20) break;
        iVar9 = (iVar20 / iVar19) * iVar25;
        iVar24 = (int)((long)iVar20 % (long)iVar19) * (int)local_298;
        iVar16 = (int)local_290 - iVar9;
        if (iVar25 < iVar16) {
          iVar16 = iVar25;
        }
        iVar25 = iVar8 - iVar24;
        if ((int)local_298 < iVar8 - iVar24) {
          iVar25 = (int)local_298;
        }
        local_168.cstep = (size_t)local_218.w;
        local_168.data =
             (void *)((long)local_218.data +
                     ((long)iVar20 % (long)iVar19 & 0xffffffffU) * local_168.cstep *
                     CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize) +
                     (long)(iVar20 / iVar19) * local_218.cstep *
                     CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize));
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = (int)local_218.elemsize;
        local_168.elemsize._4_4_ = local_218.elemsize._4_4_;
        local_168.elempack = local_218.elempack;
        local_168.allocator = local_218.allocator;
        local_168.dims = 2;
        local_168.w = local_218.w;
        local_168.h = 1;
        local_168.d = 1;
        local_168.c = 1;
        if (iVar30 == 0) {
          transpose_pack_B_tile(pMVar14 + 1,&local_168,iVar9,iVar16,iVar24,iVar25);
        }
        else {
          pack_B_tile(pMVar14 + 1,&local_168,iVar9,iVar16,iVar24,iVar25);
        }
        iVar20 = iVar20 + 1;
      }
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      if ((((int)local_230 != 0) || ((int)local_2c8 == 3)) || ((int)local_298 < iVar8)) {
        Mat::create(&local_168,iVar25 * (int)local_120,1,iVar15,4,opt->workspace_allocator);
      }
      local_288 = CONCAT71(local_288._1_7_,(int)local_230 == 0);
      local_170 = 0;
      iVar15 = (int)local_178;
      if ((int)local_178 < 1) {
        iVar15 = 0;
      }
      local_178 = CONCAT44(local_178._4_4_,iVar15);
      uVar26 = local_290;
      while( true ) {
        this = local_2b0;
        if ((int)local_170 == (int)local_178) break;
        if (iVar10 == 0) {
          iVar15 = pMVar14->elempack * (&pMVar14->h)[(ulong)(pMVar14->dims == 3) * 2];
          iVar30 = pMVar14->w;
        }
        else {
          iVar15 = pMVar14->w;
          iVar30 = pMVar14->elempack * (&pMVar14->h)[(ulong)(pMVar14->dims == 3) * 2];
        }
        iVar8 = (int)local_120;
        iVar19 = (int)local_170 * iVar8;
        iVar20 = iVar15 - iVar19;
        if (iVar8 < iVar15 - iVar19) {
          iVar20 = iVar8;
        }
        local_118.cstep = 0;
        local_118.data = (void *)0x0;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.elemsize._0_4_ = 0;
        local_118.elemsize._4_4_ = 0;
        local_118.elempack = 0;
        local_118.h = 0;
        local_118.d = 0;
        local_118.c = 0;
        local_118.allocator = (Allocator *)0x0;
        local_118.dims = 0;
        local_118.w = 0;
        if ((((int)local_230 != 0) || ((int)local_2c8 == 3)) || ((int)local_298 < iVar30)) {
          iVar15 = get_omp_thread_num();
          uVar27 = CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize);
          local_118.cstep =
               ((long)local_168.w * (long)local_168.h * uVar27 + 0xf & 0xfffffffffffffff0) / uVar27;
          if (local_168.dims == 4) {
            local_118.cstep = (long)local_168.w * (long)local_168.h;
          }
          local_118.dims = local_168.dims + -1;
          local_118.data = (void *)((long)iVar15 * uVar27 * local_168.cstep + (long)local_168.data);
          local_118.elemsize._0_4_ = (int)local_168.elemsize;
          local_118.elemsize._4_4_ = local_168.elemsize._4_4_;
          local_118.elempack = local_168.elempack;
          local_118.allocator = local_168.allocator;
          local_118.w = local_168.w;
          local_118.h = local_168.h;
          local_118.d = 1;
          local_118.c = local_168.d;
        }
        local_118.refcount._4_4_ = 0;
        local_118.refcount._0_4_ = 0;
        uVar27 = 0;
        local_228 = CONCAT44(local_228._4_4_,iVar30);
        while( true ) {
          iVar8 = (int)uVar27;
          iVar15 = (int)uVar26 - iVar8;
          if (iVar15 == 0 || (int)uVar26 < iVar8) break;
          if ((int)uVar13 < iVar15) {
            iVar15 = (int)uVar13;
          }
          local_2f8 = &local_278;
          if ((int)local_2c8 == 3) {
            local_2f8 = &local_118;
            pack_A_tile(&local_278,local_2f8,iVar19,iVar20,iVar8,iVar15);
          }
          iVar8 = iVar30;
          local_2a8 = uVar27;
          iVar31 = 0;
          while (iVar31 < iVar30) {
            iVar16 = (int)local_298;
            iVar25 = iVar8;
            if (iVar16 < iVar8) {
              iVar25 = iVar16;
            }
            iVar30 = get_omp_thread_num();
            local_c0 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
            local_90 = (size_t)local_1c8.w;
            _TILE_M = (void *)((long)local_1c8.data +
                              local_c0 * local_90 * (long)(iVar31 / iVar16) +
                              (long)iVar30 * local_1c8.cstep * local_c0);
            local_c8 = (int *)0x0;
            local_b8 = local_1c8.elempack;
            local_b0 = local_1c8.allocator;
            local_a8 = 2;
            local_a4 = local_1c8.w;
            local_a0._0_4_ = 1;
            local_a0._4_4_ = 1;
            local_98 = 1;
            local_68 = CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize);
            local_38 = (size_t)local_218.w;
            _TILE_N = (void *)((long)local_218.data +
                              local_38 * local_68 * (long)(iVar31 / iVar16) +
                              (long)(int)((long)((ulong)(uint)((int)local_2a8 >> 0x1f) << 0x20 |
                                                local_2a8 & 0xffffffff) / (long)(int)local_220) *
                              local_218.cstep * local_68);
            local_70 = (int *)0x0;
            local_60 = local_218.elempack;
            local_58 = local_218.allocator;
            local_4c = local_218.w;
            local_48._0_4_ = 1;
            local_48._4_4_ = 1;
            local_50 = local_a8;
            local_40 = local_98;
            if ((int)local_2a8 == 0) {
              if (iVar10 == 0) {
                pack_A_tile(pMVar14,(Mat *)&TILE_M,iVar19,iVar20,iVar31,iVar25);
              }
              else {
                transpose_pack_A_tile(pMVar14,(Mat *)&TILE_M,iVar19,iVar20,iVar31,iVar25);
              }
            }
            iVar30 = (int)local_228;
            gemm_transB_packed_tile
                      ((Mat *)&TILE_M,(Mat *)&TILE_N,local_2f8,&local_118,this_00,(int)local_2c8,
                       iVar19,iVar20,(int)local_2a8,iVar15,iVar31,iVar25,
                       (bool)((int)local_228 <= iVar31 + iVar16 & (byte)local_288));
            iVar8 = iVar8 - iVar16;
            iVar31 = iVar31 + iVar16;
          }
          iVar8 = (int)local_2a8;
          if ((int)local_230 != 0) {
            transpose_unpack_output_tile(&local_118,this_00,iVar19,iVar20,iVar8,iVar15);
          }
          uVar27 = (ulong)(uint)(iVar8 + (int)local_220);
          uVar26 = local_290;
          uVar13 = local_220;
        }
        local_170 = (ulong)((int)local_170 + 1);
      }
      piVar28 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar28 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_218.allocator == (Allocator *)0x0) {
            free(local_218.data);
          }
          else {
            (*(local_218.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar28 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_0045f33f;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar10 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
      local_230 = CONCAT44(local_230._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var12));
      iVar30 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      if (iVar10 == 0) {
        iVar20 = pMVar14->elempack * (&pMVar14->h)[(ulong)(pMVar14->dims == 3) * 2];
      }
      else {
        iVar20 = pMVar14->w;
      }
      local_290 = CONCAT44(local_290._4_4_,*(undefined4 *)(&local_2b0->field_0x108 + (long)p_Var12))
      ;
      get_optimal_tile_mnk
                (iVar20,*(int *)(&this->field_0xf0 + (long)p_Var12),iVar30,
                 *(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_N,&TILE_K,&TILE_K_1,iVar15);
      local_120 = (ulong)_TILE_N & 0xffffffff;
      iVar20 = (iVar20 + TILE_N + -1) / TILE_N;
      local_288 = (ulong)(uint)TILE_K_1;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_1 * TILE_N,(iVar30 + TILE_K_1 + -1) / TILE_K_1,iVar15,4,
                  opt->workspace_allocator);
      local_218.cstep = 0;
      local_218.data = (void *)0x0;
      local_218.refcount._0_4_ = 0;
      local_218.refcount._4_4_ = 0;
      local_218.elemsize._0_4_ = 0;
      local_218.elemsize._4_4_ = 0;
      local_218.elempack = 0;
      local_218.allocator = (Allocator *)0x0;
      local_218.dims = 0;
      local_218.w = 0;
      local_218.h = 0;
      local_218.d = 0;
      local_218.c = 0;
      if ((((int)local_290 != 0) || ((int)local_2c8 == 3)) || ((int)local_288 < iVar30)) {
        Mat::create(&local_218,TILE_K * (int)local_120,1,iVar15,4,opt->workspace_allocator);
      }
      local_228 = CONCAT71(local_228._1_7_,(int)local_290 == 0);
      uVar13 = 0;
      if (iVar20 < 1) {
        iVar20 = 0;
      }
      local_178 = CONCAT44(local_178._4_4_,iVar20);
      uVar26 = local_288;
      while( true ) {
        this = local_2b0;
        if ((int)uVar13 == (int)local_178) break;
        if (iVar10 == 0) {
          iVar15 = pMVar14->elempack * (&pMVar14->h)[(ulong)(pMVar14->dims == 3) * 2];
          iVar30 = pMVar14->w;
        }
        else {
          iVar15 = pMVar14->w;
          iVar30 = pMVar14->elempack * (&pMVar14->h)[(ulong)(pMVar14->dims == 3) * 2];
        }
        iVar8 = (int)local_120;
        iVar19 = (int)uVar13 * iVar8;
        iVar20 = iVar15 - iVar19;
        if (iVar8 < iVar15 - iVar19) {
          iVar20 = iVar8;
        }
        local_168.cstep = 0;
        local_168.data = (void *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = 0;
        local_168.elemsize._4_4_ = 0;
        local_168.elempack = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        local_170 = uVar13;
        if ((((int)local_290 != 0) || ((int)local_2c8 == 3)) || ((int)uVar26 < iVar30)) {
          iVar15 = get_omp_thread_num();
          uVar13 = CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize);
          local_168.cstep =
               ((long)local_218.w * (long)local_218.h * uVar13 + 0xf & 0xfffffffffffffff0) / uVar13;
          if (local_218.dims == 4) {
            local_168.cstep = (long)local_218.w * (long)local_218.h;
          }
          local_168.dims = local_218.dims + -1;
          local_168.data = (void *)((long)iVar15 * uVar13 * local_218.cstep + (long)local_218.data);
          local_168.elemsize._0_4_ = (int)local_218.elemsize;
          local_168.elemsize._4_4_ = local_218.elemsize._4_4_;
          local_168.elempack = local_218.elempack;
          local_168.allocator = local_218.allocator;
          local_168.w = local_218.w;
          local_168.h = local_218.h;
          local_168.d = 1;
          local_168.c = local_218.d;
        }
        iVar15 = TILE_K;
        local_168.refcount._4_4_ = 0;
        local_168.refcount._0_4_ = 0;
        uVar13 = 0;
        local_220 = CONCAT44(local_220._4_4_,iVar30);
        while( true ) {
          iVar31 = (int)uVar13;
          iVar8 = (int)local_230 - iVar31;
          if (iVar8 == 0 || (int)local_230 < iVar31) break;
          if (iVar15 < iVar8) {
            iVar8 = iVar15;
          }
          local_298 = &local_278;
          if ((int)local_2c8 == 3) {
            pack_A_tile(&local_278,&local_168,iVar19,iVar20,iVar31,iVar8);
            uVar26 = local_288;
            local_298 = &local_168;
          }
          iVar31 = iVar30;
          local_2a8 = uVar13;
          iVar25 = 0;
          while (iVar25 < iVar30) {
            iVar30 = (int)uVar26;
            iVar16 = iVar31;
            if (iVar30 < iVar31) {
              iVar16 = iVar30;
            }
            iVar9 = get_omp_thread_num();
            local_118.cstep = (size_t)local_1c8.w;
            local_118.data =
                 (void *)((long)local_1c8.data +
                         CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize) *
                         local_118.cstep * (long)(iVar25 / iVar30) +
                         (long)iVar9 * local_1c8.cstep *
                         CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize));
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (int)local_1c8.elemsize;
            local_118.elemsize._4_4_ = local_1c8.elemsize._4_4_;
            local_118.elempack = local_1c8.elempack;
            local_118.allocator = local_1c8.allocator;
            local_118.dims = 2;
            local_118.w = local_1c8.w;
            local_118.h = 1;
            local_118.d = 1;
            local_118.c = 1;
            local_c0 = (local_2b0->BT_data).elemsize;
            local_a4 = (local_2b0->BT_data).w;
            local_90 = (size_t)(int)local_a4;
            local_b8 = (local_2b0->BT_data).elempack;
            local_b0 = (local_2b0->BT_data).allocator;
            local_c8 = (int *)0x0;
            _TILE_M = (void *)((long)(local_2b0->BT_data).data +
                              local_90 * local_c0 * (long)(iVar25 / iVar30) +
                              (long)(int)((long)((ulong)(uint)((int)local_2a8 >> 0x1f) << 0x20 |
                                                local_2a8 & 0xffffffff) / (long)iVar15) *
                              (local_2b0->BT_data).cstep * local_c0);
            local_a0._0_4_ = 1;
            local_a0._4_4_ = 1;
            local_a8 = local_118.dims;
            local_98 = local_118.c;
            if ((int)local_2a8 == 0) {
              if (iVar10 == 0) {
                pack_A_tile(pMVar14,&local_118,iVar19,iVar20,iVar25,iVar16);
                uVar26 = local_288;
              }
              else {
                transpose_pack_A_tile(pMVar14,&local_118,iVar19,iVar20,iVar25,iVar16);
                uVar26 = local_288;
              }
            }
            iVar9 = iVar25 + (int)uVar26;
            iVar30 = (int)local_220;
            gemm_transB_packed_tile
                      (&local_118,(Mat *)&TILE_M,local_298,&local_168,this_00,(int)local_2c8,iVar19,
                       iVar20,(int)local_2a8,iVar8,iVar25,iVar16,
                       (bool)((int)local_220 <= iVar9 & (byte)local_228));
            iVar31 = iVar31 - (int)uVar26;
            iVar25 = iVar9;
          }
          iVar31 = (int)local_2a8;
          if ((int)local_290 != 0) {
            transpose_unpack_output_tile(&local_168,this_00,iVar19,iVar20,iVar31,iVar8);
          }
          uVar13 = (ulong)(uint)(iVar31 + iVar15);
        }
        uVar13 = (ulong)((int)local_170 + 1);
      }
      piVar28 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_218.allocator == (Allocator *)0x0) {
            free(local_218.data);
          }
          else {
            (*(local_218.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar28 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_0045f33f;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    uVar17 = *(uint *)(&this->field_0xec + (long)p_Var12);
    uVar13 = (ulong)uVar17;
    iVar30 = *(int *)(&this->field_0x108 + (long)p_Var12);
    local_230 = uVar13;
    if (iVar10 == 0) {
      pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar10 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var12);
      iVar20 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      if (iVar10 == 0) {
        uVar21 = pMVar14->w;
      }
      else {
        uVar21 = pMVar14->elempack * (&pMVar14->h)[(ulong)(pMVar14->dims == 3) * 2];
      }
      local_228 = (ulong)uVar21;
      get_optimal_tile_mnk
                (uVar17,uVar21,iVar20,*(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_N,&TILE_K,&TILE_K_1,iVar15);
      local_288 = (ulong)_TILE_N & 0xffffffff;
      uVar13 = (long)(int)(uVar17 + TILE_N + -1) / (long)TILE_N;
      local_2a8 = (ulong)(uint)TILE_K;
      iVar8 = ((int)local_228 + TILE_K + -1) / TILE_K;
      iVar31 = (iVar20 + TILE_K_1 + -1) / TILE_K_1;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_1 * TILE_K,iVar31,iVar8,4,opt->workspace_allocator);
      iVar8 = iVar8 * iVar31;
      iVar19 = 0;
      if (iVar8 < 1) {
        iVar8 = iVar19;
      }
      for (; iVar25 = (int)local_2a8, iVar8 != iVar19; iVar19 = iVar19 + 1) {
        iVar9 = (iVar19 / iVar31) * iVar25;
        iVar24 = (int)((long)iVar19 % (long)iVar31) * TILE_K_1;
        iVar16 = (int)local_228 - iVar9;
        if (iVar25 < iVar16) {
          iVar16 = iVar25;
        }
        iVar25 = iVar20 - iVar24;
        if (TILE_K_1 < iVar20 - iVar24) {
          iVar25 = TILE_K_1;
        }
        local_218.cstep = (size_t)local_1c8.w;
        local_218.data =
             (void *)((long)local_1c8.data +
                     ((long)iVar19 % (long)iVar31 & 0xffffffffU) * local_218.cstep *
                     CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize) +
                     (long)(iVar19 / iVar31) * local_1c8.cstep *
                     CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize));
        local_218.refcount._0_4_ = 0;
        local_218.refcount._4_4_ = 0;
        local_218.elemsize._0_4_ = (int)local_1c8.elemsize;
        local_218.elemsize._4_4_ = local_1c8.elemsize._4_4_;
        local_218.elempack = local_1c8.elempack;
        local_218.allocator = local_1c8.allocator;
        local_218.dims = 2;
        local_218.w = local_1c8.w;
        local_218.h = 1;
        local_218.d = 1;
        local_218.c = 1;
        if (iVar10 == 0) {
          transpose_pack_B_tile(pMVar14,&local_218,iVar9,iVar16,iVar24,iVar25);
        }
        else {
          pack_B_tile(pMVar14,&local_218,iVar9,iVar16,iVar24,iVar25);
        }
      }
      local_218.cstep = 0;
      local_290 = CONCAT71(local_290._1_7_,iVar30 != 0 || ((int)local_2c8 == 3 || TILE_K_1 < iVar20)
                          );
      local_218.data = (void *)0x0;
      local_218.refcount._0_4_ = 0;
      local_218.refcount._4_4_ = 0;
      local_218.elemsize._0_4_ = 0;
      local_218.elemsize._4_4_ = 0;
      local_218.elempack = 0;
      local_218.allocator = (Allocator *)0x0;
      local_218.dims = 0;
      local_218.w = 0;
      local_218.h = 0;
      local_218.d = 0;
      local_218.c = 0;
      if (iVar30 != 0 || ((int)local_2c8 == 3 || TILE_K_1 < iVar20)) {
        Mat::create(&local_218,iVar25 * (int)local_288,1,iVar15,4,opt->workspace_allocator);
      }
      local_220 = CONCAT71(local_220._1_7_,iVar30 == 0);
      pMVar29 = (Mat *)0x0;
      this = local_2b0;
      pMVar14 = (Mat *)(uVar13 & 0xffffffff);
      if ((int)uVar13 < 1) {
        pMVar14 = pMVar29;
      }
      while (pMVar29 != pMVar14) {
        iVar10 = (int)local_288;
        iVar8 = (int)pMVar29 * iVar10;
        iVar15 = (int)local_230 - iVar8;
        if (iVar10 < iVar15) {
          iVar15 = iVar10;
        }
        local_168.cstep = 0;
        local_168.data = (void *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = 0;
        local_168.elemsize._4_4_ = 0;
        local_168.elempack = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        if ((char)local_290 != '\0') {
          iVar10 = get_omp_thread_num();
          uVar13 = CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize);
          local_168.cstep =
               ((long)local_218.w * (long)local_218.h * uVar13 + 0xf & 0xfffffffffffffff0) / uVar13;
          if (local_218.dims == 4) {
            local_168.cstep = (long)local_218.w * (long)local_218.h;
          }
          local_168.dims = local_218.dims + -1;
          local_168.data = (void *)((long)iVar10 * uVar13 * local_218.cstep + (long)local_218.data);
          local_168.elemsize._0_4_ = (int)local_218.elemsize;
          local_168.elemsize._4_4_ = local_218.elemsize._4_4_;
          local_168.elempack = local_218.elempack;
          local_168.allocator = local_218.allocator;
          local_168.w = local_218.w;
          local_168.h = local_218.h;
          local_168.d = 1;
          local_168.c = local_218.d;
        }
        local_168.refcount._4_4_ = 0;
        local_168.refcount._0_4_ = 0;
        local_298 = pMVar29;
        for (iVar10 = 0; iVar19 = (int)local_228 - iVar10, iVar19 != 0 && iVar10 <= (int)local_228;
            iVar10 = iVar10 + (int)local_2a8) {
          if ((int)local_2a8 < iVar19) {
            iVar19 = (int)local_2a8;
          }
          local_2f0 = &local_278;
          if ((int)local_2c8 == 3) {
            local_2f0 = &local_168;
            pack_A_tile(&local_278,local_2f0,iVar8,iVar15,iVar10,iVar19);
          }
          iVar31 = iVar20;
          iVar25 = 0;
          while (iVar25 < iVar20) {
            iVar16 = iVar31;
            if (TILE_K_1 < iVar31) {
              iVar16 = TILE_K_1;
            }
            sVar23 = (local_2b0->AT_data).elemsize;
            local_118.w = (local_2b0->AT_data).w;
            local_118.cstep = (size_t)local_118.w;
            local_118.elempack = (local_2b0->AT_data).elempack;
            local_118.allocator = (local_2b0->AT_data).allocator;
            local_118.data =
                 (void *)((long)(local_2b0->AT_data).data +
                         sVar23 * local_118.cstep * (long)(iVar25 / TILE_K_1) +
                         (local_2b0->AT_data).cstep * (long)local_298 * sVar23);
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (int)sVar23;
            local_118.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
            local_118.dims = 2;
            local_118.h = 1;
            local_118.d = 1;
            local_118.c = 1;
            local_90 = (size_t)local_1c8.w;
            local_c0 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
            _TILE_M = (void *)((long)local_1c8.data +
                              local_90 * local_c0 * (long)(iVar25 / TILE_K_1) +
                              (long)(iVar10 / (int)local_2a8) * local_1c8.cstep * local_c0);
            local_c8 = (int *)0x0;
            iVar31 = -(TILE_K_1 - iVar31);
            local_b8 = local_1c8.elempack;
            local_b0 = local_1c8.allocator;
            local_a4 = local_1c8.w;
            local_a0._0_4_ = 1;
            local_a0._4_4_ = 1;
            local_a8 = local_118.dims;
            local_98 = local_118.c;
            gemm_transB_packed_tile
                      (&local_118,(Mat *)&TILE_M,local_2f0,&local_168,this_00,(int)local_2c8,iVar8,
                       iVar15,iVar10,iVar19,iVar25,iVar16,
                       (bool)(iVar20 <= iVar25 + TILE_K_1 & (byte)local_220));
            iVar25 = iVar25 + TILE_K_1;
          }
          if (iVar30 != 0) {
            transpose_unpack_output_tile(&local_168,this_00,iVar8,iVar15,iVar10,iVar19);
          }
          this = local_2b0;
        }
        pMVar29 = (Mat *)((long)&local_298->data + 1);
      }
      piVar28 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_218.allocator == (Allocator *)0x0) {
            free(local_218.data);
          }
          else {
            (*(local_218.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar28 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_0045f33f;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar10 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      local_290 = CONCAT44(local_290._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var12));
      get_optimal_tile_mnk
                (uVar17,*(int *)(&this->field_0xf0 + (long)p_Var12),iVar10,
                 *(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_M,&TILE_N,&TILE_K,iVar15);
      local_178 = (ulong)_TILE_M & 0xffffffff;
      uVar26 = (long)(int)(uVar17 + TILE_M + -1) / (long)TILE_M;
      local_170 = uVar26 & 0xffffffff;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      local_288 = (ulong)(uint)TILE_K;
      local_228 = CONCAT44(local_228._4_4_,iVar10);
      iVar20 = TILE_N;
      local_120 = CONCAT71(local_120._1_7_,iVar30 != 0 || ((int)local_2c8 == 3 || TILE_K < iVar10));
      if (iVar30 != 0 || ((int)local_2c8 == 3 || TILE_K < iVar10)) {
        Mat::create(&local_1c8,TILE_N * TILE_M,1,iVar15,4,opt->workspace_allocator);
      }
      if ((int)uVar26 < 1) {
        local_170 = 0;
      }
      iVar10 = (int)local_228;
      for (uVar26 = 0; uVar26 != local_170; uVar26 = uVar26 + 1) {
        iVar15 = (int)uVar26 * (int)local_178;
        uVar17 = (int)uVar13 - iVar15;
        local_298 = (Mat *)(ulong)uVar17;
        if ((int)local_178 < (int)uVar17) {
          local_298 = (Mat *)(local_178 & 0xffffffff);
        }
        local_218.cstep = 0;
        local_218.data = (void *)0x0;
        local_218.refcount._0_4_ = 0;
        local_218.refcount._4_4_ = 0;
        local_218.elemsize._0_4_ = 0;
        local_218.elemsize._4_4_ = 0;
        local_218.elempack = 0;
        local_218.h = 0;
        local_218.d = 0;
        local_218.c = 0;
        local_218.allocator = (Allocator *)0x0;
        local_218.dims = 0;
        local_218.w = 0;
        if ((char)local_120 != '\0') {
          iVar8 = get_omp_thread_num();
          uVar13 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
          local_218.cstep =
               ((long)local_1c8.w * (long)local_1c8.h * uVar13 + 0xf & 0xfffffffffffffff0) / uVar13;
          if (local_1c8.dims == 4) {
            local_218.cstep = (long)local_1c8.w * (long)local_1c8.h;
          }
          local_218.dims = local_1c8.dims + -1;
          local_218.data = (void *)((long)iVar8 * uVar13 * local_1c8.cstep + (long)local_1c8.data);
          local_218.elemsize._0_4_ = (int)local_1c8.elemsize;
          local_218.elemsize._4_4_ = local_1c8.elemsize._4_4_;
          local_218.elempack = local_1c8.elempack;
          local_218.allocator = local_1c8.allocator;
          local_218.w = local_1c8.w;
          local_218.h = local_1c8.h;
          local_218.d = 1;
          local_218.c = local_1c8.d;
        }
        local_218.refcount._4_4_ = 0;
        local_218.refcount._0_4_ = 0;
        uVar13 = 0;
        local_220 = uVar26;
        while( true ) {
          iVar19 = (int)uVar13;
          iVar8 = (int)local_290 - iVar19;
          if (iVar8 == 0 || (int)local_290 < iVar19) break;
          if (iVar20 < iVar8) {
            iVar8 = iVar20;
          }
          local_308 = &local_278;
          if ((int)local_2c8 == 3) {
            local_308 = &local_218;
            pack_A_tile(&local_278,local_308,iVar15,(int)local_298,iVar19,iVar8);
          }
          iVar19 = iVar10;
          local_2a8 = uVar13;
          iVar31 = 0;
          while( true ) {
            iVar25 = (int)local_2a8;
            if (iVar10 <= iVar31) break;
            iVar9 = (int)local_288;
            iVar16 = iVar19;
            if (iVar9 < iVar19) {
              iVar16 = iVar9;
            }
            sVar23 = (local_2b0->AT_data).elemsize;
            local_168.w = (local_2b0->AT_data).w;
            local_168.cstep = (size_t)local_168.w;
            local_168.elempack = (local_2b0->AT_data).elempack;
            local_168.allocator = (local_2b0->AT_data).allocator;
            local_168.data =
                 (void *)((long)(local_2b0->AT_data).data +
                         sVar23 * local_168.cstep * (long)(iVar31 / iVar9) +
                         (local_2b0->AT_data).cstep * uVar26 * sVar23);
            local_168.refcount._0_4_ = 0;
            local_168.refcount._4_4_ = 0;
            local_168.elemsize._0_4_ = (int)sVar23;
            local_168.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
            local_168.dims = 2;
            local_168.h = 1;
            local_168.d = 1;
            local_168.c = 1;
            local_118.w = (local_2b0->BT_data).w;
            local_118.cstep = (size_t)local_118.w;
            sVar23 = (local_2b0->BT_data).elemsize;
            local_118.elempack = (local_2b0->BT_data).elempack;
            local_118.data =
                 (void *)((long)(local_2b0->BT_data).data +
                         local_118.cstep * sVar23 * (long)(iVar31 / iVar9) +
                         (long)(int)((long)((ulong)(uint)(iVar25 >> 0x1f) << 0x20 |
                                           local_2a8 & 0xffffffff) / (long)iVar20) *
                         (local_2b0->BT_data).cstep * sVar23);
            local_118.allocator = (local_2b0->BT_data).allocator;
            iVar10 = (int)local_228;
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (int)sVar23;
            local_118.elemsize._4_4_ = (undefined4)(sVar23 >> 0x20);
            iVar19 = -(iVar9 - iVar19);
            local_118.h = 1;
            local_118.d = 1;
            local_118.dims = local_168.dims;
            local_118.c = local_168.c;
            gemm_transB_packed_tile
                      (&local_168,&local_118,local_308,&local_218,this_00,(int)local_2c8,iVar15,
                       (int)local_298,iVar25,iVar8,iVar31,iVar16,
                       (int)local_228 <= iVar31 + iVar9 && iVar30 == 0);
            uVar26 = local_220;
            iVar31 = iVar31 + iVar9;
          }
          if (iVar30 != 0) {
            transpose_unpack_output_tile(&local_218,this_00,iVar15,(int)local_298,iVar25,iVar8);
          }
          uVar13 = (ulong)(uint)(iVar25 + iVar20);
        }
        uVar13 = local_230;
        this = local_2b0;
      }
      piVar28 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar28 != (int *)0x0) {
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        if (*piVar28 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
LAB_0045f33f:
            free(local_1c8.data);
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  pp_Var2 = this->_vptr_Gemm_x86_avx512;
  if (*(float *)((long)&(this->CT_data).h + (long)pp_Var2[-3]) == 1.0) {
    iVar10 = 0;
  }
  else {
    uVar17 = (int)local_80 * (int)this_00->cstep * this_00->c;
    iVar10 = 0;
    uVar13 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar13 = 0;
    }
    for (uVar26 = 0; uVar13 != uVar26; uVar26 = uVar26 + 1) {
      *(float *)((long)this_00->data + uVar26 * 4) =
           *(float *)((long)this_00->data + uVar26 * 4) *
           *(float *)((long)&(this->CT_data).h + (long)pp_Var2[-3]);
    }
  }
LAB_0045f3af:
  piVar28 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        free(local_278.data);
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int Gemm_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return ret;
}